

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O1

void aom_highbd_quantize_b_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_60 [16];
  undefined1 auStack_50 [16];
  
  auVar20 = *(undefined1 (*) [16])zbin_ptr;
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar4 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar19 = vpsraw_avx(auVar20,0xf);
  auVar5 = vpunpcklwd_avx(auVar20,auVar19);
  auVar20 = vpunpckhwd_avx(auVar20,auVar19);
  auVar14._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar5;
  auVar14._16_16_ = ZEXT116(1) * auVar20;
  auVar20 = vpsraw_avx(auVar1,0xf);
  auVar5 = vpunpcklwd_avx(auVar1,auVar20);
  auVar20 = vpunpckhwd_avx(auVar1,auVar20);
  auVar18._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar5;
  auVar18._16_16_ = ZEXT116(1) * auVar20;
  auVar20 = vpsraw_avx(auVar2,0xf);
  local_a0 = vpunpcklwd_avx(auVar2,auVar20);
  auStack_90 = vpunpckhwd_avx(auVar2,auVar20);
  auVar20 = vpsraw_avx(auVar3,0xf);
  local_80 = vpunpcklwd_avx(auVar3,auVar20);
  auStack_70 = vpunpckhwd_avx(auVar3,auVar20);
  auVar20 = vpsraw_avx(auVar4,0xf);
  local_60 = vpunpcklwd_avx(auVar4,auVar20);
  auStack_50 = vpunpckhwd_avx(auVar4,auVar20);
  auVar16 = vpcmpeqd_avx2(ZEXT1632(local_60),ZEXT1632(local_60));
  auVar14 = vpsubd_avx2(auVar14,auVar16);
  auVar17 = vpsrad_avx2(auVar14,1);
  auVar14 = vpsubd_avx2(auVar18,auVar16);
  local_c0 = vpsrad_avx2(auVar14,1);
  local_e0 = vpaddd_avx2(auVar17,auVar16);
  auVar14 = *(undefined1 (*) [32])coeff_ptr;
  auVar18 = vpabsd_avx2(auVar14);
  auVar17 = vpcmpgtd_avx2(auVar17,auVar18);
  auVar16 = auVar16 & ~auVar17;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar16 >> 0x7f,0) == '\0') &&
        (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar16 >> 0xbf,0) == '\0') &&
      (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar16[0x1f]) {
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar15._0_32_;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar15._0_32_;
  }
  else {
    auVar16 = vpaddd_avx2(auVar18,local_c0);
    auVar16 = vpandn_avx2(auVar17,auVar16);
    auVar17._16_16_ = auStack_90;
    auVar17._0_16_ = local_a0;
    auVar25._16_16_ = auStack_50;
    auVar25._0_16_ = local_60;
    auVar18 = vpmuldq_avx2(auVar16,auVar17);
    auVar21 = vpsrlq_avx2(auVar16,0x20);
    auVar17 = vpsrlq_avx2(auVar17,0x20);
    auVar17 = vpmuldq_avx2(auVar21,auVar17);
    auVar21 = vpsrlq_avx2(auVar18,0x10);
    auVar18 = vpsllq_avx2(auVar17,0x10);
    auVar18 = vpblendd_avx2(auVar21,auVar18,0xaa);
    auVar16 = vpaddd_avx2(auVar16,auVar18);
    auVar18 = vpmuldq_avx2(auVar16,auVar25);
    auVar16 = vpsrlq_avx2(auVar16,0x20);
    auVar17 = vpsrlq_avx2(auVar25,0x20);
    auVar16 = vpmuldq_avx2(auVar16,auVar17);
    auVar18 = vpsrlq_avx2(auVar18,0xf);
    auVar16 = vpsllq_avx2(auVar16,0x11);
    auVar18 = vpblendd_avx2(auVar18,auVar16,0xaa);
    auVar16._16_16_ = auStack_70;
    auVar16._0_16_ = local_80;
    auVar16 = vpmulld_avx2(auVar18,auVar16);
    auVar17 = vpsrld_avx2(auVar16,1);
    auVar16 = vpcmpgtd_avx2(auVar18,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar18 = vpsignd_avx2(auVar18,auVar14);
    auVar14 = vpsignd_avx2(auVar17,auVar14);
    *(undefined1 (*) [32])qcoeff_ptr = auVar18;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar14;
    auVar14 = vpackssdw_avx2(auVar16,auVar16);
    auVar21._0_16_ = ZEXT116(1) * *(undefined1 (*) [16])iscan + ZEXT116(0) * auVar14._0_16_;
    auVar21._16_16_ = ZEXT116(1) * auVar14._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])iscan;
    auVar16 = vpermq_avx2(auVar14,0xd8);
    auVar14 = vpsubw_avx2(auVar21,auVar16);
    auVar14 = vpand_avx2(auVar14,auVar16);
    auVar14 = vpmaxsw_avx2(auVar14,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar15 = ZEXT3264(auVar14);
  }
  auVar20 = auVar15._0_16_;
  lVar12 = 0;
  do {
    uVar7 = *(undefined8 *)(local_c0 + lVar12);
    uVar8 = *(undefined8 *)(local_c0 + lVar12 + 8);
    *(undefined8 *)(local_e0 + lVar12) = uVar7;
    *(undefined8 *)(local_e0 + lVar12 + 8) = uVar8;
    *(undefined8 *)(local_e0 + lVar12 + 0x10) = uVar7;
    *(undefined8 *)(local_e0 + lVar12 + 0x18) = uVar8;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0xa0);
  if (8 < n_coeffs) {
    auVar9._16_16_ = auStack_90;
    auVar9._0_16_ = local_a0;
    auVar10._16_16_ = auStack_70;
    auVar10._0_16_ = local_80;
    auVar16 = vpsrad_avx2(auVar9,0x1f);
    auVar14 = vpshufd_avx2(auVar9,0xf5);
    auVar16 = vpblendd_avx2(auVar14,auVar16,0xaa);
    auVar11._16_16_ = auStack_50;
    auVar11._0_16_ = local_60;
    auVar18 = vpsrad_avx2(auVar11,0x1f);
    auVar14 = vpshufd_avx2(auVar11,0xf5);
    auVar14 = vpblendd_avx2(auVar14,auVar18,0xaa);
    lVar13 = n_coeffs + 8;
    lVar12 = 0x10;
    auVar18 = vpsrlq_avx2(auVar16,0x20);
    do {
      auVar17 = *(undefined1 (*) [32])((long)coeff_ptr + lVar12 * 2);
      auVar25 = vpabsd_avx2(auVar17);
      auVar21 = vpcmpgtd_avx2(auVar25,local_e0);
      auVar22 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar12 * 2) = auVar22;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar12 * 2) = auVar22;
      }
      else {
        auVar25 = vpaddd_avx2(auVar25,local_c0);
        auVar21 = vpand_avx2(auVar21,auVar25);
        auVar23 = vpmuldq_avx2(auVar21,auVar9);
        auVar24 = vpsrad_avx2(auVar21,0x1f);
        auVar6 = vpshufd_avx2(auVar21,0xf5);
        auVar25 = vpmuludq_avx2(auVar6,auVar18);
        auVar24 = vpsrlq_avx2(auVar24,0x20);
        auVar24 = vpmuludq_avx2(auVar24,auVar16);
        auVar25 = vpaddq_avx2(auVar25,auVar24);
        auVar24 = vpsllq_avx2(auVar25,0x20);
        auVar25 = vpmuludq_avx2(auVar6,auVar16);
        auVar25 = vpaddq_avx2(auVar25,auVar24);
        auVar23 = vpsrlq_avx2(auVar23,0x10);
        auVar25 = vpsllq_avx2(auVar25,0x10);
        auVar25 = vpblendd_avx2(auVar23,auVar25,0xaa);
        auVar25 = vpaddd_avx2(auVar21,auVar25);
        auVar21 = vpmuldq_avx2(auVar25,auVar11);
        auVar23 = vpsrad_avx2(auVar25,0x1f);
        auVar24 = vpshufd_avx2(auVar25,0xf5);
        auVar25 = vpsrlq_avx2(auVar14,0x20);
        auVar25 = vpmuludq_avx2(auVar24,auVar25);
        auVar23 = vpsrlq_avx2(auVar23,0x20);
        auVar23 = vpmuludq_avx2(auVar23,auVar14);
        auVar25 = vpaddq_avx2(auVar25,auVar23);
        auVar23 = vpsllq_avx2(auVar25,0x20);
        auVar25 = vpmuludq_avx2(auVar24,auVar14);
        auVar25 = vpaddq_avx2(auVar25,auVar23);
        auVar21 = vpsrlq_avx2(auVar21,0xf);
        auVar25 = vpsllq_avx2(auVar25,0x11);
        auVar21 = vpblendd_avx2(auVar21,auVar25,0xaa);
        auVar25 = vpmulld_avx2(auVar10,auVar21);
        auVar23 = vpsrld_avx2(auVar25,1);
        auVar25 = vpcmpgtd_avx2(auVar21,auVar22);
        auVar21 = vpsignd_avx2(auVar21,auVar17);
        auVar17 = vpsignd_avx2(auVar23,auVar17);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar12 * 2) = auVar21;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar12 * 2) = auVar17;
        auVar17 = vpackssdw_avx2(auVar25,auVar25);
        auVar22._0_16_ =
             ZEXT116(0) * auVar15._0_16_ + ZEXT116(1) * *(undefined1 (*) [16])((long)iscan + lVar12)
        ;
        auVar22._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15._0_16_;
        auVar25 = vpermq_avx2(auVar17,0xd8);
        auVar17 = vpsubw_avx2(auVar22,auVar25);
        auVar17 = vpand_avx2(auVar17,auVar25);
        auVar17 = vpmaxsw_avx2(auVar17,auVar15._0_32_);
        auVar15 = ZEXT3264(auVar17);
      }
      auVar20 = auVar15._0_16_;
      lVar12 = lVar12 + 0x10;
      lVar13 = lVar13 + -8;
    } while (0x10 < lVar13);
  }
  auVar1 = vpshufd_avx(auVar20,0xe);
  auVar20 = vpmaxsw_avx(auVar20,auVar1);
  auVar1 = vpshuflw_avx(auVar20,0xe);
  auVar20 = vpmaxsw_avx(auVar20,auVar1);
  auVar1 = vpshuflw_avx(auVar20,1);
  auVar20 = vpmaxsw_avx(auVar20,auVar1);
  vpextrw_avx(auVar20,0);
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const unsigned int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];
  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 1);

  quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 1);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 1);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}